

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  int iVar9;
  uint uVar10;
  U32 UVar11;
  U32 UVar12;
  U32 UVar13;
  U32 UVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  size_t sVar19;
  size_t sVar20;
  BYTE *pBVar21;
  long lVar22;
  bool bVar23;
  uint local_5f4;
  uint local_5f0;
  uint local_5ac;
  uint local_5a8;
  uint local_564;
  uint local_560;
  uint local_51c;
  uint local_518;
  U32 mls;
  ZSTD_compressionParameters *cParams;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOff_3;
  size_t rLength_3;
  size_t step_3;
  U32 offcode_3;
  BYTE *match1_3;
  BYTE *match0_3;
  BYTE *repMatch_3;
  U32 matchIndex1_3;
  U32 matchIndex0_3;
  U32 current1_3;
  U32 current0_3;
  U32 val1_3;
  size_t h1_3;
  U32 val0_3;
  size_t h0_3;
  BYTE *ip2_3;
  size_t mLength_3;
  U32 maxRep_3;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *prefixStart_3;
  BYTE *pBStack_3e0;
  U32 prefixStartIndex_3;
  BYTE *anchor_3;
  BYTE *ip1_3;
  BYTE *ip0_3;
  BYTE *istart_3;
  BYTE *base_3;
  size_t stepSize_3;
  U32 hlog_3;
  U32 *hashTable_3;
  ZSTD_compressionParameters *cParams_4;
  U32 tmpOff_2;
  size_t rLength_2;
  size_t step_2;
  U32 offcode_2;
  BYTE *match1_2;
  BYTE *match0_2;
  BYTE *repMatch_2;
  U32 matchIndex1_2;
  U32 matchIndex0_2;
  U32 current1_2;
  U32 current0_2;
  U32 val1_2;
  size_t h1_2;
  U32 val0_2;
  size_t h0_2;
  BYTE *ip2_2;
  size_t mLength_2;
  U32 maxRep_2;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *prefixStart_2;
  BYTE *pBStack_2c0;
  U32 prefixStartIndex_2;
  BYTE *anchor_2;
  BYTE *ip1_2;
  BYTE *ip0_2;
  BYTE *istart_2;
  BYTE *base_2;
  size_t stepSize_2;
  U32 hlog_2;
  U32 *hashTable_2;
  ZSTD_compressionParameters *cParams_3;
  U32 tmpOff_1;
  size_t rLength_1;
  size_t step_1;
  U32 offcode_1;
  BYTE *match1_1;
  BYTE *match0_1;
  BYTE *repMatch_1;
  U32 matchIndex1_1;
  U32 matchIndex0_1;
  U32 current1_1;
  U32 current0_1;
  U32 val1_1;
  size_t h1_1;
  U32 val0_1;
  size_t h0_1;
  BYTE *ip2_1;
  size_t mLength_1;
  U32 maxRep_1;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixStart_1;
  BYTE *pBStack_1a0;
  U32 prefixStartIndex_1;
  BYTE *anchor_1;
  BYTE *ip1_1;
  BYTE *ip0_1;
  BYTE *istart_1;
  BYTE *base_1;
  size_t stepSize_1;
  U32 hlog_1;
  U32 *hashTable_1;
  ZSTD_compressionParameters *cParams_2;
  U32 tmpOff;
  size_t rLength;
  size_t step;
  U32 offcode;
  BYTE *match1;
  BYTE *match0;
  BYTE *repMatch;
  U32 matchIndex1;
  U32 matchIndex0;
  U32 current1;
  U32 current0;
  U32 val1;
  size_t h1;
  U32 val0;
  size_t h0;
  BYTE *ip2;
  size_t mLength;
  U32 maxRep;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixStart;
  BYTE *pBStack_80;
  U32 prefixStartIndex;
  BYTE *anchor;
  BYTE *ip1;
  BYTE *ip0;
  BYTE *istart;
  BYTE *base;
  size_t stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams_1;
  
  switch((ms->cParams).minMatch) {
  default:
    pUVar7 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar2 = (ms->cParams).targetLength;
    uVar3 = (ms->cParams).targetLength;
    pBVar8 = (ms->window).base;
    uVar4 = (ms->window).dictLimit;
    pBVar15 = pBVar8 + uVar4;
    pBVar16 = (BYTE *)((long)src + srcSize);
    pBVar17 = pBVar16 + -8;
    uVar5 = *rep;
    uVar6 = rep[1];
    mLength._4_4_ = 0;
    ip1 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar15));
    anchor = ip1 + 1;
    uVar10 = (int)ip1 - (int)pBVar15;
    maxRep = uVar6;
    if (uVar10 < uVar6) {
      maxRep = 0;
      mLength._4_4_ = uVar6;
    }
    offsetSaved = uVar5;
    pBStack_80 = (BYTE *)src;
    if (uVar10 < uVar5) {
      offsetSaved = 0;
      mLength._4_4_ = uVar5;
    }
    while (anchor < pBVar17) {
      pBVar18 = ip1 + 2;
      sVar19 = ZSTD_hashPtr(ip1,UVar1,4);
      UVar11 = MEM_read32(ip1);
      sVar20 = ZSTD_hashPtr(anchor,UVar1,4);
      UVar12 = MEM_read32(anchor);
      iVar9 = (int)pBVar8;
      uVar10 = (int)ip1 - iVar9;
      uVar5 = pUVar7[sVar19];
      uVar6 = pUVar7[sVar20];
      pBVar21 = pBVar18 + -(ulong)offsetSaved;
      match1 = pBVar8 + uVar5;
      pUVar7[sVar19] = uVar10;
      pUVar7[sVar20] = (int)anchor - iVar9;
      UVar13 = MEM_read32(pBVar21);
      UVar14 = MEM_read32(pBVar18);
      if (offsetSaved == 0 || UVar13 != UVar14) {
        if ((uVar4 < uVar5) && (UVar13 = MEM_read32(match1), UVar13 == UVar11)) {
LAB_001176cd:
          maxRep = offsetSaved;
          offsetSaved = (int)ip1 - (int)match1;
          step._4_4_ = offsetSaved + 2;
          ip2 = (BYTE *)0x0;
          while( true ) {
            bVar23 = false;
            if (pBStack_80 < ip1 && pBVar15 < match1) {
              bVar23 = ip1[-1] == match1[-1];
            }
            if (!bVar23) break;
            ip1 = ip1 + -1;
            match1 = match1 + -1;
            ip2 = ip2 + 1;
          }
          goto LAB_0011779d;
        }
        if ((uVar4 < uVar6) && (UVar11 = MEM_read32(pBVar8 + uVar6), UVar11 == UVar12)) {
          ip1 = anchor;
          match1 = pBVar8 + uVar6;
          goto LAB_001176cd;
        }
        lVar22 = ((long)ip1 - (long)pBStack_80 >> 7) +
                 (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1) + 1);
        ip1 = ip1 + lVar22;
        anchor = anchor + lVar22;
      }
      else {
        ip2 = (BYTE *)(long)(int)(uint)(ip1[1] == pBVar21[-1]);
        ip1 = pBVar18 + -(long)ip2;
        match1 = pBVar21 + -(long)ip2;
        step._4_4_ = 0;
LAB_0011779d:
        sVar19 = ZSTD_count(ip1 + (long)ip2 + 4,match1 + (long)ip2 + 4,pBVar16);
        ZSTD_storeSeq(seqStore,(long)ip1 - (long)pBStack_80,pBStack_80,step._4_4_,
                      (size_t)(ip2 + sVar19 + 4 + -3));
        pBStack_80 = ip2 + sVar19 + 4 + (long)ip1;
        anchor = pBStack_80 + 1;
        ip1 = pBStack_80;
        if (pBStack_80 <= pBVar17) {
          sVar19 = ZSTD_hashPtr(pBVar8 + (ulong)uVar10 + 2,UVar1,4);
          pUVar7[sVar19] = uVar10 + 2;
          sVar19 = ZSTD_hashPtr(pBStack_80 + -2,UVar1,4);
          pUVar7[sVar19] = ((int)pBStack_80 + -2) - iVar9;
          ip1 = pBStack_80;
          while( true ) {
            UVar11 = maxRep;
            bVar23 = false;
            if (ip1 <= pBVar17) {
              UVar12 = MEM_read32(ip1);
              UVar13 = MEM_read32(ip1 + -(ulong)maxRep);
              bVar23 = maxRep != 0 && UVar12 == UVar13;
            }
            pBStack_80 = ip1;
            if (!bVar23) break;
            sVar19 = ZSTD_count(ip1 + 4,ip1 + (4 - (ulong)maxRep),pBVar16);
            maxRep = offsetSaved;
            offsetSaved = UVar11;
            sVar20 = ZSTD_hashPtr(ip1,UVar1,4);
            pUVar7[sVar20] = (int)ip1 - iVar9;
            anchor = ip1 + sVar19 + 4 + 1;
            ZSTD_storeSeq(seqStore,0,ip1,0,sVar19 + 1);
            ip1 = ip1 + sVar19 + 4;
          }
        }
      }
    }
    if (offsetSaved == 0) {
      local_518 = mLength._4_4_;
    }
    else {
      local_518 = offsetSaved;
    }
    *rep = local_518;
    if (maxRep == 0) {
      local_51c = mLength._4_4_;
    }
    else {
      local_51c = maxRep;
    }
    rep[1] = local_51c;
    ms_local = (ZSTD_matchState_t *)(pBVar16 + -(long)pBStack_80);
    break;
  case 5:
    pUVar7 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar2 = (ms->cParams).targetLength;
    uVar3 = (ms->cParams).targetLength;
    pBVar8 = (ms->window).base;
    uVar4 = (ms->window).dictLimit;
    pBVar15 = pBVar8 + uVar4;
    pBVar16 = (BYTE *)((long)src + srcSize);
    pBVar17 = pBVar16 + -8;
    uVar5 = *rep;
    uVar6 = rep[1];
    mLength_1._4_4_ = 0;
    ip1_1 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar15));
    anchor_1 = ip1_1 + 1;
    uVar10 = (int)ip1_1 - (int)pBVar15;
    maxRep_1 = uVar6;
    if (uVar10 < uVar6) {
      maxRep_1 = 0;
      mLength_1._4_4_ = uVar6;
    }
    offsetSaved_1 = uVar5;
    pBStack_1a0 = (BYTE *)src;
    if (uVar10 < uVar5) {
      offsetSaved_1 = 0;
      mLength_1._4_4_ = uVar5;
    }
    while (anchor_1 < pBVar17) {
      pBVar18 = ip1_1 + 2;
      sVar19 = ZSTD_hashPtr(ip1_1,UVar1,5);
      UVar11 = MEM_read32(ip1_1);
      sVar20 = ZSTD_hashPtr(anchor_1,UVar1,5);
      UVar12 = MEM_read32(anchor_1);
      iVar9 = (int)pBVar8;
      uVar10 = (int)ip1_1 - iVar9;
      uVar5 = pUVar7[sVar19];
      uVar6 = pUVar7[sVar20];
      pBVar21 = pBVar18 + -(ulong)offsetSaved_1;
      match1_1 = pBVar8 + uVar5;
      pUVar7[sVar19] = uVar10;
      pUVar7[sVar20] = (int)anchor_1 - iVar9;
      UVar13 = MEM_read32(pBVar21);
      UVar14 = MEM_read32(pBVar18);
      if (offsetSaved_1 == 0 || UVar13 != UVar14) {
        if ((uVar4 < uVar5) && (UVar13 = MEM_read32(match1_1), UVar13 == UVar11)) {
LAB_00117f8c:
          maxRep_1 = offsetSaved_1;
          offsetSaved_1 = (int)ip1_1 - (int)match1_1;
          step_1._4_4_ = offsetSaved_1 + 2;
          ip2_1 = (BYTE *)0x0;
          while( true ) {
            bVar23 = false;
            if (pBStack_1a0 < ip1_1 && pBVar15 < match1_1) {
              bVar23 = ip1_1[-1] == match1_1[-1];
            }
            if (!bVar23) break;
            ip1_1 = ip1_1 + -1;
            match1_1 = match1_1 + -1;
            ip2_1 = ip2_1 + 1;
          }
          goto LAB_0011806e;
        }
        if ((uVar4 < uVar6) && (UVar11 = MEM_read32(pBVar8 + uVar6), UVar11 == UVar12)) {
          ip1_1 = anchor_1;
          match1_1 = pBVar8 + uVar6;
          goto LAB_00117f8c;
        }
        lVar22 = ((long)ip1_1 - (long)pBStack_1a0 >> 7) +
                 (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1) + 1);
        ip1_1 = ip1_1 + lVar22;
        anchor_1 = anchor_1 + lVar22;
      }
      else {
        ip2_1 = (BYTE *)(long)(int)(uint)(ip1_1[1] == pBVar21[-1]);
        ip1_1 = pBVar18 + -(long)ip2_1;
        match1_1 = pBVar21 + -(long)ip2_1;
        step_1._4_4_ = 0;
LAB_0011806e:
        sVar19 = ZSTD_count(ip1_1 + (long)ip2_1 + 4,match1_1 + (long)ip2_1 + 4,pBVar16);
        ZSTD_storeSeq(seqStore,(long)ip1_1 - (long)pBStack_1a0,pBStack_1a0,step_1._4_4_,
                      (size_t)(ip2_1 + sVar19 + 4 + -3));
        pBStack_1a0 = ip2_1 + sVar19 + 4 + (long)ip1_1;
        anchor_1 = pBStack_1a0 + 1;
        ip1_1 = pBStack_1a0;
        if (pBStack_1a0 <= pBVar17) {
          sVar19 = ZSTD_hashPtr(pBVar8 + (ulong)uVar10 + 2,UVar1,5);
          pUVar7[sVar19] = uVar10 + 2;
          sVar19 = ZSTD_hashPtr(pBStack_1a0 + -2,UVar1,5);
          pUVar7[sVar19] = ((int)pBStack_1a0 + -2) - iVar9;
          ip1_1 = pBStack_1a0;
          while( true ) {
            UVar11 = maxRep_1;
            bVar23 = false;
            if (ip1_1 <= pBVar17) {
              UVar12 = MEM_read32(ip1_1);
              UVar13 = MEM_read32(ip1_1 + -(ulong)maxRep_1);
              bVar23 = maxRep_1 != 0 && UVar12 == UVar13;
            }
            pBStack_1a0 = ip1_1;
            if (!bVar23) break;
            sVar19 = ZSTD_count(ip1_1 + 4,ip1_1 + (4 - (ulong)maxRep_1),pBVar16);
            maxRep_1 = offsetSaved_1;
            offsetSaved_1 = UVar11;
            sVar20 = ZSTD_hashPtr(ip1_1,UVar1,5);
            pUVar7[sVar20] = (int)ip1_1 - iVar9;
            anchor_1 = ip1_1 + sVar19 + 4 + 1;
            ZSTD_storeSeq(seqStore,0,ip1_1,0,sVar19 + 1);
            ip1_1 = ip1_1 + sVar19 + 4;
          }
        }
      }
    }
    if (offsetSaved_1 == 0) {
      local_560 = mLength_1._4_4_;
    }
    else {
      local_560 = offsetSaved_1;
    }
    *rep = local_560;
    if (maxRep_1 == 0) {
      local_564 = mLength_1._4_4_;
    }
    else {
      local_564 = maxRep_1;
    }
    rep[1] = local_564;
    ms_local = (ZSTD_matchState_t *)(pBVar16 + -(long)pBStack_1a0);
    break;
  case 6:
    pUVar7 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar2 = (ms->cParams).targetLength;
    uVar3 = (ms->cParams).targetLength;
    pBVar8 = (ms->window).base;
    uVar4 = (ms->window).dictLimit;
    pBVar15 = pBVar8 + uVar4;
    pBVar16 = (BYTE *)((long)src + srcSize);
    pBVar17 = pBVar16 + -8;
    uVar5 = *rep;
    uVar6 = rep[1];
    mLength_2._4_4_ = 0;
    ip1_2 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar15));
    anchor_2 = ip1_2 + 1;
    uVar10 = (int)ip1_2 - (int)pBVar15;
    maxRep_2 = uVar6;
    if (uVar10 < uVar6) {
      maxRep_2 = 0;
      mLength_2._4_4_ = uVar6;
    }
    offsetSaved_2 = uVar5;
    pBStack_2c0 = (BYTE *)src;
    if (uVar10 < uVar5) {
      offsetSaved_2 = 0;
      mLength_2._4_4_ = uVar5;
    }
    while (anchor_2 < pBVar17) {
      pBVar18 = ip1_2 + 2;
      sVar19 = ZSTD_hashPtr(ip1_2,UVar1,6);
      UVar11 = MEM_read32(ip1_2);
      sVar20 = ZSTD_hashPtr(anchor_2,UVar1,6);
      UVar12 = MEM_read32(anchor_2);
      iVar9 = (int)pBVar8;
      uVar10 = (int)ip1_2 - iVar9;
      uVar5 = pUVar7[sVar19];
      uVar6 = pUVar7[sVar20];
      pBVar21 = pBVar18 + -(ulong)offsetSaved_2;
      match1_2 = pBVar8 + uVar5;
      pUVar7[sVar19] = uVar10;
      pUVar7[sVar20] = (int)anchor_2 - iVar9;
      UVar13 = MEM_read32(pBVar21);
      UVar14 = MEM_read32(pBVar18);
      if (offsetSaved_2 == 0 || UVar13 != UVar14) {
        if ((uVar4 < uVar5) && (UVar13 = MEM_read32(match1_2), UVar13 == UVar11)) {
LAB_001188e1:
          maxRep_2 = offsetSaved_2;
          offsetSaved_2 = (int)ip1_2 - (int)match1_2;
          step_2._4_4_ = offsetSaved_2 + 2;
          ip2_2 = (BYTE *)0x0;
          while( true ) {
            bVar23 = false;
            if (pBStack_2c0 < ip1_2 && pBVar15 < match1_2) {
              bVar23 = ip1_2[-1] == match1_2[-1];
            }
            if (!bVar23) break;
            ip1_2 = ip1_2 + -1;
            match1_2 = match1_2 + -1;
            ip2_2 = ip2_2 + 1;
          }
          goto LAB_001189c3;
        }
        if ((uVar4 < uVar6) && (UVar11 = MEM_read32(pBVar8 + uVar6), UVar11 == UVar12)) {
          ip1_2 = anchor_2;
          match1_2 = pBVar8 + uVar6;
          goto LAB_001188e1;
        }
        lVar22 = ((long)ip1_2 - (long)pBStack_2c0 >> 7) +
                 (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1) + 1);
        ip1_2 = ip1_2 + lVar22;
        anchor_2 = anchor_2 + lVar22;
      }
      else {
        ip2_2 = (BYTE *)(long)(int)(uint)(ip1_2[1] == pBVar21[-1]);
        ip1_2 = pBVar18 + -(long)ip2_2;
        match1_2 = pBVar21 + -(long)ip2_2;
        step_2._4_4_ = 0;
LAB_001189c3:
        sVar19 = ZSTD_count(ip1_2 + (long)ip2_2 + 4,match1_2 + (long)ip2_2 + 4,pBVar16);
        ZSTD_storeSeq(seqStore,(long)ip1_2 - (long)pBStack_2c0,pBStack_2c0,step_2._4_4_,
                      (size_t)(ip2_2 + sVar19 + 4 + -3));
        pBStack_2c0 = ip2_2 + sVar19 + 4 + (long)ip1_2;
        anchor_2 = pBStack_2c0 + 1;
        ip1_2 = pBStack_2c0;
        if (pBStack_2c0 <= pBVar17) {
          sVar19 = ZSTD_hashPtr(pBVar8 + (ulong)uVar10 + 2,UVar1,6);
          pUVar7[sVar19] = uVar10 + 2;
          sVar19 = ZSTD_hashPtr(pBStack_2c0 + -2,UVar1,6);
          pUVar7[sVar19] = ((int)pBStack_2c0 + -2) - iVar9;
          ip1_2 = pBStack_2c0;
          while( true ) {
            UVar11 = maxRep_2;
            bVar23 = false;
            if (ip1_2 <= pBVar17) {
              UVar12 = MEM_read32(ip1_2);
              UVar13 = MEM_read32(ip1_2 + -(ulong)maxRep_2);
              bVar23 = maxRep_2 != 0 && UVar12 == UVar13;
            }
            pBStack_2c0 = ip1_2;
            if (!bVar23) break;
            sVar19 = ZSTD_count(ip1_2 + 4,ip1_2 + (4 - (ulong)maxRep_2),pBVar16);
            maxRep_2 = offsetSaved_2;
            offsetSaved_2 = UVar11;
            sVar20 = ZSTD_hashPtr(ip1_2,UVar1,6);
            pUVar7[sVar20] = (int)ip1_2 - iVar9;
            anchor_2 = ip1_2 + sVar19 + 4 + 1;
            ZSTD_storeSeq(seqStore,0,ip1_2,0,sVar19 + 1);
            ip1_2 = ip1_2 + sVar19 + 4;
          }
        }
      }
    }
    if (offsetSaved_2 == 0) {
      local_5a8 = mLength_2._4_4_;
    }
    else {
      local_5a8 = offsetSaved_2;
    }
    *rep = local_5a8;
    if (maxRep_2 == 0) {
      local_5ac = mLength_2._4_4_;
    }
    else {
      local_5ac = maxRep_2;
    }
    rep[1] = local_5ac;
    ms_local = (ZSTD_matchState_t *)(pBVar16 + -(long)pBStack_2c0);
    break;
  case 7:
    pUVar7 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar2 = (ms->cParams).targetLength;
    uVar3 = (ms->cParams).targetLength;
    pBVar8 = (ms->window).base;
    uVar4 = (ms->window).dictLimit;
    pBVar15 = pBVar8 + uVar4;
    pBVar16 = (BYTE *)((long)src + srcSize);
    pBVar17 = pBVar16 + -8;
    uVar5 = *rep;
    uVar6 = rep[1];
    mLength_3._4_4_ = 0;
    ip1_3 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar15));
    anchor_3 = ip1_3 + 1;
    uVar10 = (int)ip1_3 - (int)pBVar15;
    maxRep_3 = uVar6;
    if (uVar10 < uVar6) {
      maxRep_3 = 0;
      mLength_3._4_4_ = uVar6;
    }
    offsetSaved_3 = uVar5;
    pBStack_3e0 = (BYTE *)src;
    if (uVar10 < uVar5) {
      offsetSaved_3 = 0;
      mLength_3._4_4_ = uVar5;
    }
    while (anchor_3 < pBVar17) {
      pBVar18 = ip1_3 + 2;
      sVar19 = ZSTD_hashPtr(ip1_3,UVar1,7);
      UVar11 = MEM_read32(ip1_3);
      sVar20 = ZSTD_hashPtr(anchor_3,UVar1,7);
      UVar12 = MEM_read32(anchor_3);
      iVar9 = (int)pBVar8;
      uVar10 = (int)ip1_3 - iVar9;
      uVar5 = pUVar7[sVar19];
      uVar6 = pUVar7[sVar20];
      pBVar21 = pBVar18 + -(ulong)offsetSaved_3;
      match1_3 = pBVar8 + uVar5;
      pUVar7[sVar19] = uVar10;
      pUVar7[sVar20] = (int)anchor_3 - iVar9;
      UVar13 = MEM_read32(pBVar21);
      UVar14 = MEM_read32(pBVar18);
      if (offsetSaved_3 == 0 || UVar13 != UVar14) {
        if ((uVar4 < uVar5) && (UVar13 = MEM_read32(match1_3), UVar13 == UVar11)) {
LAB_00119236:
          maxRep_3 = offsetSaved_3;
          offsetSaved_3 = (int)ip1_3 - (int)match1_3;
          step_3._4_4_ = offsetSaved_3 + 2;
          ip2_3 = (BYTE *)0x0;
          while( true ) {
            bVar23 = false;
            if (pBStack_3e0 < ip1_3 && pBVar15 < match1_3) {
              bVar23 = ip1_3[-1] == match1_3[-1];
            }
            if (!bVar23) break;
            ip1_3 = ip1_3 + -1;
            match1_3 = match1_3 + -1;
            ip2_3 = ip2_3 + 1;
          }
          goto LAB_00119318;
        }
        if ((uVar4 < uVar6) && (UVar11 = MEM_read32(pBVar8 + uVar6), UVar11 == UVar12)) {
          ip1_3 = anchor_3;
          match1_3 = pBVar8 + uVar6;
          goto LAB_00119236;
        }
        lVar22 = ((long)ip1_3 - (long)pBStack_3e0 >> 7) +
                 (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1) + 1);
        ip1_3 = ip1_3 + lVar22;
        anchor_3 = anchor_3 + lVar22;
      }
      else {
        ip2_3 = (BYTE *)(long)(int)(uint)(ip1_3[1] == pBVar21[-1]);
        ip1_3 = pBVar18 + -(long)ip2_3;
        match1_3 = pBVar21 + -(long)ip2_3;
        step_3._4_4_ = 0;
LAB_00119318:
        sVar19 = ZSTD_count(ip1_3 + (long)ip2_3 + 4,match1_3 + (long)ip2_3 + 4,pBVar16);
        ZSTD_storeSeq(seqStore,(long)ip1_3 - (long)pBStack_3e0,pBStack_3e0,step_3._4_4_,
                      (size_t)(ip2_3 + sVar19 + 4 + -3));
        pBStack_3e0 = ip2_3 + sVar19 + 4 + (long)ip1_3;
        anchor_3 = pBStack_3e0 + 1;
        ip1_3 = pBStack_3e0;
        if (pBStack_3e0 <= pBVar17) {
          sVar19 = ZSTD_hashPtr(pBVar8 + (ulong)uVar10 + 2,UVar1,7);
          pUVar7[sVar19] = uVar10 + 2;
          sVar19 = ZSTD_hashPtr(pBStack_3e0 + -2,UVar1,7);
          pUVar7[sVar19] = ((int)pBStack_3e0 + -2) - iVar9;
          ip1_3 = pBStack_3e0;
          while( true ) {
            UVar11 = maxRep_3;
            bVar23 = false;
            if (ip1_3 <= pBVar17) {
              UVar12 = MEM_read32(ip1_3);
              UVar13 = MEM_read32(ip1_3 + -(ulong)maxRep_3);
              bVar23 = maxRep_3 != 0 && UVar12 == UVar13;
            }
            pBStack_3e0 = ip1_3;
            if (!bVar23) break;
            sVar19 = ZSTD_count(ip1_3 + 4,ip1_3 + (4 - (ulong)maxRep_3),pBVar16);
            maxRep_3 = offsetSaved_3;
            offsetSaved_3 = UVar11;
            sVar20 = ZSTD_hashPtr(ip1_3,UVar1,7);
            pUVar7[sVar20] = (int)ip1_3 - iVar9;
            anchor_3 = ip1_3 + sVar19 + 4 + 1;
            ZSTD_storeSeq(seqStore,0,ip1_3,0,sVar19 + 1);
            ip1_3 = ip1_3 + sVar19 + 4;
          }
        }
      }
    }
    if (offsetSaved_3 == 0) {
      local_5f0 = mLength_3._4_4_;
    }
    else {
      local_5f0 = offsetSaved_3;
    }
    *rep = local_5f0;
    if (maxRep_3 == 0) {
      local_5f4 = mLength_3._4_4_;
    }
    else {
      local_5f4 = maxRep_3;
    }
    rep[1] = local_5f4;
    ms_local = (ZSTD_matchState_t *)(pBVar16 + -(long)pBStack_3e0);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}